

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::run(tests *specification,texts *arguments,ostream *os)

{
  options option_00;
  count *this;
  action *this_00;
  ptags *this_01;
  times *this_02;
  confirm *this_03;
  tms *in_RDX;
  tms *__buffer;
  exception *e;
  confirm confirm_;
  times times_;
  ptags ptags_;
  print print_;
  count count_;
  texts in;
  options option;
  tests *in_stack_00000fd0;
  options in_stack_00000fe0;
  ostream *in_stack_fffffffffffffc38;
  count *in_stack_fffffffffffffc40;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc48;
  ptags *in_stack_fffffffffffffc50;
  ptags *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  confirm *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  vector<lest::test,_std::allocator<lest::test>_> *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  count *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffcf4;
  times *in_stack_fffffffffffffcf8;
  texts *in_stack_fffffffffffffd00;
  tests *in_stack_fffffffffffffd08;
  tests *specification_00;
  tms local_278 [2];
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_238;
  confirm *in_stack_fffffffffffffdf0;
  texts *in_stack_fffffffffffffeb8;
  options local_38;
  tms *local_20;
  int local_4;
  
  local_20 = in_RDX;
  options::options(&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10792b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc90,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  split_arguments(in_stack_fffffffffffffeb8);
  std::tie<lest::options,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&in_stack_fffffffffffffc48->first,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc40);
  std::tuple<lest::options&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
  ::operator=((tuple<lest::options_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
               *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  std::
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~pair((pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x107998);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc50);
  if ((local_38.lexical & 1U) != 0) {
    sort((tests *)in_stack_fffffffffffffc40);
  }
  if ((local_38.random & 1U) != 0) {
    in_stack_fffffffffffffc38 =
         (ostream *)
         CONCAT26(local_38._6_2_,
                  CONCAT15(local_38.time,
                           CONCAT14(local_38.tags,
                                    CONCAT13(local_38.list,
                                             CONCAT12(local_38.count,
                                                      CONCAT11(local_38.abort,local_38.help))))));
    in_stack_fffffffffffffc40 =
         (count *)CONCAT44(local_38.repeat,
                           CONCAT13(local_38.version,
                                    CONCAT12(local_38.verbose,
                                             CONCAT11(local_38.random,local_38.lexical))));
    in_stack_fffffffffffffc48 =
         (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_38.seed;
    shuffle(in_stack_00000fd0,in_stack_00000fe0);
  }
  if ((local_38.help & 1U) == 0) {
    if ((local_38.version & 1U) == 0) {
      if ((local_38.count & 1U) == 0) {
        if ((local_38.list & 1U) == 0) {
          if ((local_38.tags & 1U) == 0) {
            if ((local_38.time & 1U) == 0) {
              specification_00 =
                   (tests *)CONCAT26(local_38._6_2_,
                                     CONCAT15(local_38.time,
                                              CONCAT14(local_38.tags,
                                                       CONCAT13(local_38.list,
                                                                CONCAT12(local_38.count,
                                                                         CONCAT11(local_38.abort,
                                                                                  local_38.help)))))
                                    );
              option_00.lexical = (bool)(char)in_stack_fffffffffffffc98;
              option_00.random = (bool)(char)((uint)in_stack_fffffffffffffc98 >> 8);
              option_00.verbose = (bool)(char)((uint)in_stack_fffffffffffffc98 >> 0x10);
              option_00.version = (bool)(char)((uint)in_stack_fffffffffffffc98 >> 0x18);
              option_00._0_8_ = in_stack_fffffffffffffc90;
              option_00.repeat = in_stack_fffffffffffffc9c;
              option_00.seed = (seed_t)in_stack_fffffffffffffca0;
              confirm::confirm(in_stack_fffffffffffffc80,
                               (ostream *)
                               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                               option_00);
              std::vector<lest::test,_std::allocator<lest::test>_>::vector
                        (in_stack_fffffffffffffc90,
                         (vector<lest::test,_std::allocator<lest::test>_> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffc90,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              this_03 = for_test<lest::confirm>
                                  (specification_00,in_stack_fffffffffffffd00,
                                   (confirm *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
              local_4 = confirm::operator_cast_to_int(this_03);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc50);
              std::vector<lest::test,_std::allocator<lest::test>_>::~vector
                        ((vector<lest::test,_std::allocator<lest::test>_> *)
                         in_stack_fffffffffffffc50);
              confirm::~confirm(in_stack_fffffffffffffdf0);
            }
            else {
              local_238 = (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_38.seed;
              times::times((times *)&stack0xfffffffffffffdd0,local_20);
              std::vector<lest::test,_std::allocator<lest::test>_>::vector
                        (in_stack_fffffffffffffc90,
                         (vector<lest::test,_std::allocator<lest::test>_> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffc90,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              __buffer = local_278;
              this_02 = for_test<lest::times>
                                  (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                                   in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
              local_4 = times::operator_cast_to_int(this_02);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc50);
              std::vector<lest::test,_std::allocator<lest::test>_>::~vector
                        ((vector<lest::test,_std::allocator<lest::test>_> *)
                         in_stack_fffffffffffffc50);
              times::~times((times *)&stack0xfffffffffffffdd0,__buffer);
            }
          }
          else {
            ptags::ptags(in_stack_fffffffffffffc50,(ostream *)in_stack_fffffffffffffc48);
            std::vector<lest::test,_std::allocator<lest::test>_>::vector
                      (in_stack_fffffffffffffc90,
                       (vector<lest::test,_std::allocator<lest::test>_> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc90,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            this_01 = for_test<lest::ptags>
                                (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                                 (ptags *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
            local_4 = action::operator_cast_to_int(&this_01->super_action);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffc50);
            std::vector<lest::test,_std::allocator<lest::test>_>::~vector
                      ((vector<lest::test,_std::allocator<lest::test>_> *)in_stack_fffffffffffffc50)
            ;
            ptags::~ptags(in_stack_fffffffffffffc70);
          }
        }
        else {
          print::print((print *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
          std::vector<lest::test,_std::allocator<lest::test>_>::vector
                    (in_stack_fffffffffffffc90,
                     (vector<lest::test,_std::allocator<lest::test>_> *)
                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc90,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          this_00 = &for_test<lest::print>
                               (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                                (print *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4)->
                     super_action;
          local_4 = action::operator_cast_to_int(this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc50);
          std::vector<lest::test,_std::allocator<lest::test>_>::~vector
                    ((vector<lest::test,_std::allocator<lest::test>_> *)in_stack_fffffffffffffc50);
        }
      }
      else {
        count::count(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        std::vector<lest::test,_std::allocator<lest::test>_>::vector
                  (in_stack_fffffffffffffc90,
                   (vector<lest::test,_std::allocator<lest::test>_> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffc90,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        this = for_test<lest::count>
                         (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                          (count *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
        local_4 = action::operator_cast_to_int(&this->super_action);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc50);
        std::vector<lest::test,_std::allocator<lest::test>_>::~vector
                  ((vector<lest::test,_std::allocator<lest::test>_> *)in_stack_fffffffffffffc50);
        count::~count(in_stack_fffffffffffffca0);
      }
    }
    else {
      local_4 = version((ostream *)in_stack_fffffffffffffca0);
    }
  }
  else {
    local_4 = usage((ostream *)0x107a84);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc50);
  return local_4;
}

Assistant:

inline int run( tests specification, texts arguments, std::ostream & os = std::cout )
{
    try
    {
        options option; texts in;
        tie( option, in ) = split_arguments( arguments );

        if ( option.lexical ) {    sort( specification         ); }
        if ( option.random  ) { shuffle( specification, option ); }

        if ( option.help    ) { return usage  ( os ); }
        if ( option.version ) { return version( os ); }
        if ( option.count   ) { count count_( os         ); return for_test( specification, in, count_ ); }
        if ( option.list    ) { print print_( os         ); return for_test( specification, in, print_ ); }
        if ( option.tags    ) { ptags ptags_( os         ); return for_test( specification, in, ptags_ ); }
        if ( option.time    ) { times times_( os, option ); return for_test( specification, in, times_ ); }

        { confirm confirm_( os, option ); return for_test( specification, in, confirm_, option.repeat ); }
    }
    catch ( std::exception const & e )
    {
        os << "Error: " << e.what() << "\n";
        return 1;
    }
}